

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error asmjit::v1_14::CodeHolder_evaluateExpression(CodeHolder *self,Expression *exp,uint64_t *out)

{
  long lVar1;
  Error EVar2;
  Environment EVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  uint64_t *extraout_RDX;
  ulong uVar7;
  Error EVar8;
  long lVar9;
  uint64_t value [2];
  Environment local_38;
  
  EVar8 = 3;
  for (lVar9 = 1; lVar9 != 3; lVar9 = lVar9 + 1) {
    EVar3._subArch = kHost;
    EVar3._vendor = kHost;
    EVar3._platform = kUnknown;
    EVar3._platformABI = kUnknown;
    EVar3._objectFormat = kUnknown;
    EVar3._floatABI = kHardFloat;
    EVar3._reserved = '\0';
    EVar3._arch = (&(self->_environment)._arch)[lVar9];
    switch(EVar3) {
    case (Environment)0x0:
      break;
    case (Environment)0x1:
      EVar3 = (&self->_environment)[lVar9];
      break;
    case (Environment)0x2:
      lVar1 = *(long *)((long)(&self->_environment)[lVar9] + 0x20);
      if (lVar1 == 0) {
        return 0x43;
      }
      EVar3 = (Environment)
              (*(long *)((long)(&self->_environment)[lVar9] + 0x18) + *(long *)(lVar1 + 0x10));
      break;
    case (Environment)0x3:
      EVar2 = CodeHolder_evaluateExpression
                        ((CodeHolder *)(&self->_environment)[lVar9],(Expression *)&local_38,out);
      EVar3 = local_38;
      out = extraout_RDX;
      if (EVar2 != 0) {
        return EVar2;
      }
      break;
    default:
      goto switchD_00112422_default;
    }
    *(Environment *)(value + lVar9 + -1) = EVar3;
  }
  bVar5 = (byte)value[1];
  switch((self->_environment)._arch) {
  case kUnknown:
    uVar4 = value[1] + value[0];
    break;
  case k32BitMask:
    uVar4 = value[0] - value[1];
    break;
  case kHost:
    uVar4 = value[1] * value[0];
    break;
  case kRISCV32:
    uVar7 = value[0] << (bVar5 & 0x3f);
    goto LAB_001124b3;
  case kRISCV64:
    uVar7 = value[0] >> (bVar5 & 0x3f);
LAB_001124b3:
    uVar4 = 0;
    if (value[1] < 0x40) {
      uVar4 = uVar7;
    }
    break;
  case kARM:
    bVar6 = 0x3f;
    if (value[1] < 0x3f) {
      bVar6 = bVar5;
    }
    uVar4 = (long)value[0] >> (bVar6 & 0x3f);
    break;
  default:
    return 3;
  }
  exp->opType = (char)uVar4;
  exp->valueType[0] = (char)(uVar4 >> 8);
  exp->valueType[1] = (char)(uVar4 >> 0x10);
  exp->reserved[0] = (char)(uVar4 >> 0x18);
  exp->reserved[1] = (char)(uVar4 >> 0x20);
  exp->reserved[2] = (char)(uVar4 >> 0x28);
  exp->reserved[3] = (char)(uVar4 >> 0x30);
  exp->reserved[4] = (char)(uVar4 >> 0x38);
  EVar8 = 0;
switchD_00112422_default:
  return EVar8;
}

Assistant:

static Error CodeHolder_evaluateExpression(CodeHolder* self, Expression* exp, uint64_t* out) noexcept {
  uint64_t value[2];
  for (size_t i = 0; i < 2; i++) {
    uint64_t v;
    switch (exp->valueType[i]) {
      case ExpressionValueType::kNone: {
        v = 0;
        break;
      }

      case ExpressionValueType::kConstant: {
        v = exp->value[i].constant;
        break;
      }

      case ExpressionValueType::kLabel: {
        LabelEntry* le = exp->value[i].label;
        if (!le->isBound())
          return DebugUtils::errored(kErrorExpressionLabelNotBound);
        v = le->section()->offset() + le->offset();
        break;
      }

      case ExpressionValueType::kExpression: {
        Expression* nested = exp->value[i].expression;
        ASMJIT_PROPAGATE(CodeHolder_evaluateExpression(self, nested, &v));
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    value[i] = v;
  }

  uint64_t result;
  uint64_t& a = value[0];
  uint64_t& b = value[1];

  switch (exp->opType) {
    case ExpressionOpType::kAdd:
      result = a + b;
      break;

    case ExpressionOpType::kSub:
      result = a - b;
      break;

    case ExpressionOpType::kMul:
      result = a * b;
      break;

    case ExpressionOpType::kSll:
      result = (b > 63) ? uint64_t(0) : uint64_t(a << b);
      break;

    case ExpressionOpType::kSrl:
      result = (b > 63) ? uint64_t(0) : uint64_t(a >> b);
      break;

    case ExpressionOpType::kSra:
      result = Support::sar(a, Support::min<uint64_t>(b, 63));
      break;

    default:
      return DebugUtils::errored(kErrorInvalidState);
  }

  *out = result;
  return kErrorOk;
}